

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

ConstTestNodeIterator *
xe::ConstTestNodeIterator::begin(ConstTestNodeIterator *__return_storage_ptr__,TestNode *root)

{
  GroupState local_30;
  undefined1 local_19;
  TestNode *local_18;
  TestNode *root_local;
  ConstTestNodeIterator *iter;
  
  local_19 = 0;
  local_18 = root;
  root_local = (TestNode *)__return_storage_ptr__;
  ConstTestNodeIterator(__return_storage_ptr__,root);
  GroupState::GroupState(&local_30,(TestGroup *)0x0);
  std::
  vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ::push_back(&__return_storage_ptr__->m_iterStack,&local_30);
  return __return_storage_ptr__;
}

Assistant:

ConstTestNodeIterator ConstTestNodeIterator::begin (const TestNode* root)
{
	ConstTestNodeIterator iter(root);
	iter.m_iterStack.push_back(GroupState(DE_NULL));
	return iter;
}